

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forces_and_moments.cpp
# Opt level: O0

double __thiscall InitShift::calculate(InitShift *this,double x,int degree)

{
  double dVar1;
  int degree_local;
  double x_local;
  InitShift *this_local;
  
  dVar1 = Term::calculatePolinomAtPoint(&this->super_Term,x,this->force,-degree);
  return dVar1;
}

Assistant:

double InitShift::calculate(double x, int degree) const
{
    // Added IJ as a force for easier counting
    return calculatePolinomAtPoint(x, force, -degree);
}